

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

int cmsysProcess_SetWorkingDirectory(cmsysProcess *cp,char *dir)

{
  int iVar1;
  char *pcVar2;
  
  if (cp == (cmsysProcess *)0x0) {
    return 0;
  }
  pcVar2 = cp->WorkingDirectory;
  if (pcVar2 == dir) {
    return 1;
  }
  if (dir == (char *)0x0 || pcVar2 == (char *)0x0) {
    if (pcVar2 == (char *)0x0) goto LAB_003d0df6;
  }
  else {
    iVar1 = strcmp(pcVar2,dir);
    if (iVar1 == 0) {
      return 1;
    }
  }
  free(pcVar2);
  cp->WorkingDirectory = (char *)0x0;
LAB_003d0df6:
  if (dir != (char *)0x0) {
    pcVar2 = strdup(dir);
    cp->WorkingDirectory = pcVar2;
    if (pcVar2 == (char *)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int kwsysProcess_SetWorkingDirectory(kwsysProcess* cp, const char* dir)
{
  if (!cp) {
    return 0;
  }
  if (cp->WorkingDirectory == dir) {
    return 1;
  }
  if (cp->WorkingDirectory && dir && strcmp(cp->WorkingDirectory, dir) == 0) {
    return 1;
  }
  if (cp->WorkingDirectory) {
    free(cp->WorkingDirectory);
    cp->WorkingDirectory = 0;
  }
  if (dir) {
    cp->WorkingDirectory = strdup(dir);
    if (!cp->WorkingDirectory) {
      return 0;
    }
  }
  return 1;
}